

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

uint8_t * google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                    (UnknownFieldSet *unknown_fields,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  int iVar2;
  Type TVar3;
  uint32_t uVar4;
  UnknownField *this;
  uint64_t uVar5;
  string *s;
  size_t __n;
  void *__src;
  uint8_t *puVar6;
  UnknownFieldSet *unknown_fields_00;
  uint uVar7;
  UnknownField *field;
  int i;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  UnknownFieldSet *unknown_fields_local;
  ptrdiff_t size;
  EpsCopyOutputStream *local_28;
  uint8_t *local_20;
  uint local_14;
  uint8_t *local_10;
  
  stream_local = (EpsCopyOutputStream *)target;
  for (field._4_4_ = 0; iVar2 = UnknownFieldSet::field_count(unknown_fields), field._4_4_ < iVar2;
      field._4_4_ = field._4_4_ + 1) {
    this = UnknownFieldSet::field(unknown_fields,field._4_4_);
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    TVar3 = UnknownField::type(this);
    switch(TVar3) {
    case TYPE_VARINT:
      iVar2 = UnknownField::number(this);
      uVar5 = UnknownField::varint(this);
      stream_local = (EpsCopyOutputStream *)
                     WireFormatLite::WriteUInt64ToArray(iVar2,uVar5,(uint8_t *)stream_local);
      break;
    case TYPE_FIXED32:
      iVar2 = UnknownField::number(this);
      uVar4 = UnknownField::fixed32(this);
      stream_local = (EpsCopyOutputStream *)
                     WireFormatLite::WriteFixed32ToArray(iVar2,uVar4,(uint8_t *)stream_local);
      break;
    case TYPE_FIXED64:
      iVar2 = UnknownField::number(this);
      uVar5 = UnknownField::fixed64(this);
      stream_local = (EpsCopyOutputStream *)
                     WireFormatLite::WriteFixed64ToArray(iVar2,uVar5,(uint8_t *)stream_local);
      break;
    case TYPE_LENGTH_DELIMITED:
      uVar4 = UnknownField::number(this);
      s = UnknownField::length_delimited_abi_cxx11_(this);
      __n = std::__cxx11::string::size();
      bVar1 = true;
      if ((long)__n < 0x80) {
        puVar6 = stream->end_;
        iVar2 = io::EpsCopyOutputStream::TagSize(uVar4 << 3);
        bVar1 = (long)(puVar6 + (-(long)iVar2 - (long)stream_local) + 0xf) < (long)__n;
      }
      if (bVar1) {
        local_28 = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::WriteStringOutline
                             (stream,uVar4,s,(uint8_t *)stream_local);
      }
      else {
        uVar7 = uVar4 << 3 | 2;
        *(uint8_t *)&stream_local->end_ = (uint8_t)uVar7;
        if (uVar7 < 0x80) {
          local_10 = (uint8_t *)((long)&stream_local->end_ + 1);
        }
        else {
          *(byte *)&stream_local->end_ = *(byte *)&stream_local->end_ | 0x80;
          local_14 = (uVar4 << 3) >> 7;
          *(uint8_t *)((long)&stream_local->end_ + 1) = (uint8_t)local_14;
          if (local_14 < 0x80) {
            local_10 = (uint8_t *)((long)&stream_local->end_ + 2);
          }
          else {
            local_20 = (uint8_t *)((long)&stream_local->end_ + 2);
            do {
              local_20[-1] = local_20[-1] | 0x80;
              local_14 = local_14 >> 7;
              *local_20 = (uint8_t)local_14;
              local_20 = local_20 + 1;
              local_10 = local_20;
            } while (0x7f < local_14);
          }
        }
        *local_10 = (uint8_t)__n;
        __src = (void *)std::__cxx11::string::data();
        memcpy(local_10 + 1,__src,__n);
        local_28 = (EpsCopyOutputStream *)(local_10 + 1 + __n);
      }
      stream_local = local_28;
      break;
    case TYPE_GROUP:
      iVar2 = UnknownField::number(this);
      puVar6 = WireFormatLite::WriteTagToArray(iVar2,WIRETYPE_START_GROUP,(uint8_t *)stream_local);
      unknown_fields_00 = UnknownField::group(this);
      puVar6 = InternalSerializeUnknownFieldsToArray(unknown_fields_00,puVar6,stream);
      puVar6 = io::EpsCopyOutputStream::EnsureSpace(stream,puVar6);
      iVar2 = UnknownField::number(this);
      stream_local = (EpsCopyOutputStream *)
                     WireFormatLite::WriteTagToArray(iVar2,WIRETYPE_END_GROUP,puVar6);
    }
  }
  return (uint8_t *)stream_local;
}

Assistant:

uint8_t* WireFormat::InternalSerializeUnknownFieldsToArray(
    const UnknownFieldSet& unknown_fields, uint8_t* target,
    io::EpsCopyOutputStream* stream) {
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);

    target = stream->EnsureSpace(target);
    switch (field.type()) {
      case UnknownField::TYPE_VARINT:
        target = WireFormatLite::WriteUInt64ToArray(field.number(),
                                                    field.varint(), target);
        break;
      case UnknownField::TYPE_FIXED32:
        target = WireFormatLite::WriteFixed32ToArray(field.number(),
                                                     field.fixed32(), target);
        break;
      case UnknownField::TYPE_FIXED64:
        target = WireFormatLite::WriteFixed64ToArray(field.number(),
                                                     field.fixed64(), target);
        break;
      case UnknownField::TYPE_LENGTH_DELIMITED:
        target = stream->WriteString(field.number(), field.length_delimited(),
                                     target);
        break;
      case UnknownField::TYPE_GROUP:
        target = WireFormatLite::WriteTagToArray(
            field.number(), WireFormatLite::WIRETYPE_START_GROUP, target);
        target = InternalSerializeUnknownFieldsToArray(field.group(), target,
                                                       stream);
        target = stream->EnsureSpace(target);
        target = WireFormatLite::WriteTagToArray(
            field.number(), WireFormatLite::WIRETYPE_END_GROUP, target);
        break;
    }
  }
  return target;
}